

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O3

void __thiscall CLayerGroup::CLayerGroup(CLayerGroup *this)

{
  (this->m_lLayers).list = (CLayer **)0x0;
  array<CLayer_*,_allocator_default<CLayer_*>_>::clear(&this->m_lLayers);
  this->m_aName[0] = '\0';
  this->m_GameGroup = false;
  this->m_Visible = true;
  this->m_SaveToMap = true;
  this->m_Collapse = false;
  this->m_OffsetX = 0;
  this->m_OffsetY = 0;
  this->m_ParallaxX = 100;
  this->m_ParallaxY = 100;
  this->m_UseClipping = 0;
  this->m_ClipX = 0;
  this->m_ClipY = 0;
  this->m_ClipW = 0;
  this->m_ClipH = 0;
  return;
}

Assistant:

CLayerGroup::CLayerGroup()
{
	m_aName[0] = 0;
	m_Visible = true;
	m_SaveToMap = true;
	m_Collapse = false;
	m_GameGroup = false;
	m_OffsetX = 0;
	m_OffsetY = 0;
	m_ParallaxX = 100;
	m_ParallaxY = 100;

	m_UseClipping = 0;
	m_ClipX = 0;
	m_ClipY = 0;
	m_ClipW = 0;
	m_ClipH = 0;
}